

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test
           *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  undefined1 local_90 [8];
  MockNamedValue parameter;
  undefined1 local_30 [8];
  TypeForTestingExpectedFunctionCall equalType;
  TypeForTestingExpectedFunctionCall type;
  TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test
  *this_local;
  
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&equalType.value,1);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)local_30,1);
  SimpleString::SimpleString(&local_a0,"name");
  MockNamedValue::MockNamedValue((MockNamedValue *)local_90,&local_a0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::SimpleString(&local_b0,"type");
  MockNamedValue::setConstObjectPointer((MockNamedValue *)local_90,&local_b0,local_30);
  SimpleString::~SimpleString(&local_b0);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&local_c0,"type");
  SimpleString::SimpleString(&local_d0,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])
            (pMVar1,&local_c0,&local_d0,&equalType.value);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::~SimpleString(&local_c0);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2b])(pMVar1,local_90);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)((byte)((byte)iVar2 ^ 1) & 1),"CHECK",
             "!call->hasInputParameter(parameter)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x167,pTVar4);
  MockNamedValue::~MockNamedValue((MockNamedValue *)local_90);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)local_30);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall
            ((TypeForTestingExpectedFunctionCall *)&equalType.value);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparisonButFailsWithoutRepository)
{
    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);
    call->withParameterOfType("type", "name", &type);
    CHECK(!call->hasInputParameter(parameter));
}